

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O2

bool __thiscall
Assimp::COBImporter::CanRead(COBImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  bool bVar2;
  string local_50;
  char *tokens [1];
  
  BaseImporter::GetExtension(&local_50,pFile);
  bVar1 = std::operator==(&local_50,"cob");
  bVar2 = true;
  if (bVar1) goto LAB_0044eac9;
  bVar1 = std::operator==(&local_50,"scn");
  if (bVar1) goto LAB_0044eac9;
  bVar1 = std::operator==(&local_50,"COB");
  if (bVar1) goto LAB_0044eac9;
  bVar1 = std::operator==(&local_50,"SCN");
  if (bVar1) goto LAB_0044eac9;
  if (local_50._M_string_length == 0) {
    if (pIOHandler != (IOSystem *)0x0) goto LAB_0044ea9d;
  }
  else if (pIOHandler != (IOSystem *)0x0 && checkSig) {
LAB_0044ea9d:
    tokens[0] = "Caligary";
    bVar2 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,tokens,1,200,false,false);
    goto LAB_0044eac9;
  }
  bVar2 = false;
LAB_0044eac9:
  std::__cxx11::string::~string((string *)&local_50);
  return bVar2;
}

Assistant:

bool COBImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    const std::string& extension = GetExtension(pFile);
    if (extension == "cob" || extension == "scn" || extension == "COB" || extension == "SCN") {
        return true;
    }

    else if ((!extension.length() || checkSig) && pIOHandler)   {
        const char* tokens[] = {"Caligary"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1);
    }
    return false;
}